

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:68:21)>
::getImpl(SimpleTransformPromiseNode<unsigned_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:68:21)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *pEVar1;
  uint *in;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_540;
  ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> local_538;
  uint *local_390;
  uint *depValue;
  uint *_depValue779;
  Exception *local_1d8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1b8 [8];
  ExceptionOr<unsigned_int> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<unsigned_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:68:21)>
  *this_local;
  
  depResult.value.ptr = (NullableValue<unsigned_int>)output;
  ExceptionOr<unsigned_int>::ExceptionOr((ExceptionOr<unsigned_int> *)local_1b8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1b8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<unsigned_int>
                         ((Maybe<unsigned_int> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (uint *)0x0) {
      local_390 = depValue;
      in = mv<unsigned_int>(depValue);
      MaybeVoidCaller<unsigned_int,kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>::
      apply<kj::(anonymous_namespace)::TestCase56::run()::__0>
                ((MaybeVoidCaller<unsigned_int,kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
                  *)&local_540,&this->func,in);
      TransformPromiseNodeBase::handle<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
                (&local_538,&this->super_TransformPromiseNodeBase,&local_540);
      pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
                         ((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::operator=
                (pEVar1,&local_538);
      ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::~ExceptionOr
                (&local_538);
      Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(&local_540);
    }
  }
  else {
    local_1d8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)
               &_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
                       ((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)
                      &_depValue779);
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::~ExceptionOr
              ((ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)
               &_depValue779);
  }
  ExceptionOr<unsigned_int>::~ExceptionOr((ExceptionOr<unsigned_int> *)local_1b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }